

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

void __thiscall absl::lts_20250127::log_internal::LogMessage::PrepareToDie(LogMessage *this)

{
  bool symbolize_stacktrace;
  int max_num_frames;
  pointer pLVar1;
  pointer pLVar2;
  undefined1 in_R8B;
  Span<absl::lts_20250127::LogSink_*> SVar3;
  LogEntry *local_20;
  size_type local_18;
  LogMessage *this_local;
  
  pLVar1 = std::
           unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  if ((pLVar1->first_fatal & 1U) != 0) {
    pLVar1 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    AbslInternalOnFatalLogMessage_lts_20250127(&pLVar1->entry);
  }
  pLVar1 = std::
           unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  if ((pLVar1->fail_quietly & 1U) == 0) {
    pLVar1 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    pLVar2 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    SVar3 = MakeSpan<absl::lts_20250127::InlinedVector<absl::lts_20250127::LogSink_*,_16UL,_std::allocator<absl::lts_20250127::LogSink_*>_>_>
                      (&pLVar2->extra_sinks);
    pLVar2 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    local_20 = (LogEntry *)SVar3.ptr_;
    local_18 = SVar3.len_;
    SVar3.len_._0_1_ = pLVar2->extra_sinks_only & 1;
    SVar3.ptr_ = (pointer)local_18;
    SVar3.len_._1_7_ = 0;
    LogToSinks((log_internal *)pLVar1,local_20,SVar3,(bool)in_R8B);
    pLVar1 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    std::__cxx11::string::operator=
              ((string *)&(pLVar1->entry).stacktrace_,"*** Check failure stack trace: ***\n");
    max_num_frames = MaxFramesInLogStackTrace();
    symbolize_stacktrace = ShouldSymbolizeLogStackTrace();
    pLVar1 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    debugging_internal::DumpStackTrace
              (0,max_num_frames,symbolize_stacktrace,anon_unknown_4::WriteToString,
               &(pLVar1->entry).stacktrace_);
  }
  return;
}

Assistant:

void LogMessage::PrepareToDie() {
  // If we log a FATAL message, flush all the log destinations, then toss
  // a signal for others to catch. We leave the logs in a state that
  // someone else can use them (as long as they flush afterwards)
  if (data_->first_fatal) {
    // Notify observers about the upcoming fatal error.
    ABSL_INTERNAL_C_SYMBOL(AbslInternalOnFatalLogMessage)(data_->entry);
  }

  if (!data_->fail_quietly) {
    // Log the message first before we start collecting stack trace.
    log_internal::LogToSinks(data_->entry, absl::MakeSpan(data_->extra_sinks),
                             data_->extra_sinks_only);

    // `DumpStackTrace` generates an empty string under MSVC.
    // Adding the constant prefix here simplifies testing.
    data_->entry.stacktrace_ = "*** Check failure stack trace: ***\n";
    debugging_internal::DumpStackTrace(
        0, log_internal::MaxFramesInLogStackTrace(),
        log_internal::ShouldSymbolizeLogStackTrace(), WriteToString,
        &data_->entry.stacktrace_);
  }
}